

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joysticks.c
# Opt level: O2

void joystick_callback(int joy,int event)

{
  ulong in_RAX;
  long lVar1;
  char *pcVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  int *piVar6;
  int button_count;
  int axis_count;
  undefined8 local_28;
  
  if (event == 0x40001) {
    local_28 = in_RAX;
    glfwGetJoystickAxes(joy,(int *)((long)&local_28 + 4));
    glfwGetJoystickButtons(joy,(int *)&local_28);
    pcVar2 = glfwGetJoystickName(joy);
    printf("Found joystick %i named \'%s\' with %i axes, %i buttons\n",(ulong)(joy + 1),pcVar2,
           local_28 >> 0x20,local_28 & 0xffffffff);
    lVar1 = (long)joystick_count;
    joystick_count = joystick_count + 1;
    joysticks[lVar1] = joy;
  }
  else if (event == 0x40002) {
    lVar1 = (long)joystick_count;
    uVar5 = 0;
    uVar3 = 0;
    if (0 < joystick_count) {
      uVar3 = (ulong)(uint)joystick_count;
    }
    for (piVar6 = joysticks; (uVar4 = uVar3, uVar3 != uVar5 && (uVar4 = uVar5, *piVar6 != joy));
        piVar6 = piVar6 + 1) {
      uVar5 = uVar5 + 1;
    }
    while (uVar4 = uVar4 + 1, (long)uVar4 < lVar1) {
      *(int *)(&DAT_0012c55c + uVar4 * 4) = joysticks[uVar4];
    }
    printf("Lost joystick %i\n",(ulong)(joy + 1));
    joystick_count = joystick_count + -1;
  }
  return;
}

Assistant:

static void joystick_callback(int joy, int event)
{
    if (event == GLFW_CONNECTED)
    {
        int axis_count, button_count;

        glfwGetJoystickAxes(joy, &axis_count);
        glfwGetJoystickButtons(joy, &button_count);

        printf("Found joystick %i named \'%s\' with %i axes, %i buttons\n",
                joy + 1,
                glfwGetJoystickName(joy),
                axis_count,
                button_count);

        joysticks[joystick_count++] = joy;
    }
    else if (event == GLFW_DISCONNECTED)
    {
        int i;

        for (i = 0;  i < joystick_count;  i++)
        {
            if (joysticks[i] == joy)
                break;
        }

        for (i = i + 1;  i < joystick_count;  i++)
            joysticks[i - 1] = joysticks[i];

        printf("Lost joystick %i\n", joy + 1);
        joystick_count--;
    }
}